

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O0

_Bool gppmap(settings_r *sesskey,char *name,Conf *conf,int primary)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  char *newkey;
  char *pcStack_58;
  int c;
  char *val;
  char *key;
  char *q;
  char *p;
  char *buf;
  int primary_local;
  Conf *conf_local;
  char *name_local;
  settings_r *sesskey_local;
  
  while (pcVar2 = conf_get_str_nthstrkey(conf,primary,0), pcVar2 != (char *)0x0) {
    conf_del_str_str(conf,primary,pcVar2);
  }
  pcVar2 = gpps_raw(sesskey,name,(char *)0x0);
  q = pcVar2;
  if (pcVar2 == (char *)0x0) {
    sesskey_local._7_1_ = false;
  }
  else {
    while (*q != '\0') {
      pcStack_58 = (char *)0x0;
      key = pcVar2;
      while( true ) {
        bVar5 = false;
        if (*q != '\0') {
          bVar5 = *q != ',';
        }
        if (!bVar5) break;
        cVar1 = *q;
        if (cVar1 == '=') {
          cVar1 = '\0';
        }
        pcVar3 = q + 1;
        if (cVar1 == '\\') {
          cVar1 = q[1];
          pcVar3 = q + 2;
        }
        q = pcVar3;
        pcVar3 = key + 1;
        *key = cVar1;
        key = pcVar3;
        if (cVar1 == '\0') {
          pcStack_58 = pcVar3;
        }
      }
      if (*q == ',') {
        q = q + 1;
      }
      if (pcStack_58 == (char *)0x0) {
        pcStack_58 = key;
      }
      *key = '\0';
      if ((primary == 0xb0) && (pcVar3 = strchr(pcVar2,0x44), pcVar3 != (char *)0x0)) {
        pcVar3 = dupstr(pcVar2);
        pcVar4 = strchr(pcVar3,0x44);
        *pcVar4 = 'L';
        conf_set_str_str(conf,0xb0,pcVar3,"D");
        safefree(pcVar3);
      }
      else {
        conf_set_str_str(conf,primary,pcVar2,pcStack_58);
      }
    }
    safefree(pcVar2);
    sesskey_local._7_1_ = true;
  }
  return sesskey_local._7_1_;
}

Assistant:

static bool gppmap(settings_r *sesskey, const char *name,
                   Conf *conf, int primary)
{
    char *buf, *p, *q, *key, *val;

    /*
     * Start by clearing any existing subkeys of this key from conf.
     */
    while ((key = conf_get_str_nthstrkey(conf, primary, 0)) != NULL)
        conf_del_str_str(conf, primary, key);

    /*
     * Now read a serialised list from the settings and unmarshal it
     * into its components.
     */
    buf = gpps_raw(sesskey, name, NULL);
    if (!buf)
        return false;

    p = buf;
    while (*p) {
        q = buf;
        val = NULL;
        while (*p && *p != ',') {
            int c = *p++;
            if (c == '=')
                c = '\0';
            if (c == '\\')
                c = *p++;
            *q++ = c;
            if (!c)
                val = q;
        }
        if (*p == ',')
            p++;
        if (!val)
            val = q;
        *q = '\0';

        if (primary == CONF_portfwd && strchr(buf, 'D') != NULL) {
            /*
             * Backwards-compatibility hack: dynamic forwardings are
             * indexed in the data store as a third type letter in the
             * key, 'D' alongside 'L' and 'R' - but really, they
             * should be filed under 'L' with a special _value_,
             * because local and dynamic forwardings both involve
             * _listening_ on a local port, and are hence mutually
             * exclusive on the same port number. So here we translate
             * the legacy storage format into the sensible internal
             * form, by finding the D and turning it into a L.
             */
            char *newkey = dupstr(buf);
            *strchr(newkey, 'D') = 'L';
            conf_set_str_str(conf, primary, newkey, "D");
            sfree(newkey);
        } else {
            conf_set_str_str(conf, primary, buf, val);
        }
    }
    sfree(buf);

    return true;
}